

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O0

Fraction operator*(Fraction *a,int *b)

{
  int *b_local;
  Fraction *a_local;
  Fraction current_frac;
  
  a_local._0_4_ = (*a).numerator_;
  a_local = (Fraction *)CONCAT44((*a).denominator_,*b * (int)a_local);
  Fraction::Normalization((Fraction *)&a_local);
  return (Fraction)a_local;
}

Assistant:

Fraction operator*(const Fraction& a, const int& b) {
  Fraction current_frac = a;
  current_frac.numerator_ *= b;
  current_frac.Normalization();
  return current_frac;
}